

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Msg.cpp
# Opt level: O0

Msg * __thiscall util::logging::Msg::operator+(Msg *__return_storage_ptr__,Msg *this,string *val)

{
  M_Level lvl;
  undefined1 local_60 [64];
  string *local_20;
  string *val_local;
  Msg *this_local;
  
  local_20 = val;
  val_local = (string *)this;
  this_local = __return_storage_ptr__;
  getMsg_txt_abi_cxx11_((Msg *)local_60);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_60 + 0x20),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  lvl = getMsg_lvl(this);
  Msg(__return_storage_ptr__,(string *)(local_60 + 0x20),lvl);
  std::__cxx11::string::~string((string *)(local_60 + 0x20));
  std::__cxx11::string::~string((string *)local_60);
  return __return_storage_ptr__;
}

Assistant:

Msg Msg::operator+( const std::string & val)
		{
			return Msg(getMsg_txt() + val, getMsg_lvl());
		}